

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O3

Lit __thiscall IntVarEL::createSetLit(IntVarEL *this,vec<Lit> *head)

{
  int iVar1;
  Lit *pLVar2;
  long lVar3;
  Lit q;
  IntVarEL *pIVar4;
  ulong uVar5;
  Clause *c;
  ChannelInfo *pCVar6;
  int i;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int v;
  vec<int> local_58;
  IntVarEL *local_40;
  int local_34;
  
  iVar7 = this->lit_min;
  iVar8 = this->lit_max;
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (int *)0x0;
  uVar5 = (ulong)head->sz;
  local_40 = this;
  if (uVar5 != 0) {
    pLVar2 = head->data;
    lVar3 = 0x3f;
    if (uVar5 != 0) {
      for (; head->sz >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::__introsort_loop<Lit*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pLVar2,pLVar2 + uVar5,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<Lit*,__gnu_cxx::__ops::_Iter_less_iter>(pLVar2);
    uVar5 = (ulong)head->sz;
    if (uVar5 != 0) {
      uVar10 = 0;
      do {
        uVar9 = head->data[uVar10].x;
        uVar11 = (int)uVar9 >> 1;
        if (*(int *)(sat.c_info.data + uVar11) < 0) {
          iVar13 = sat.c_info.data[uVar11].val;
          if ((uVar9 & 1) == 0) {
            if (iVar7 <= iVar13) {
              iVar7 = iVar13 + 1;
            }
          }
          else if (iVar13 < iVar8) {
            iVar8 = iVar13;
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar5 != uVar10);
      if (head->sz != 0) {
        uVar10 = 0;
        pCVar6 = sat.c_info.data;
        do {
          uVar9 = head->data[uVar10].x >> 1;
          if (-1 < *(int *)(pCVar6 + uVar9)) {
            local_34 = pCVar6[uVar9].val;
            if ((head->data[uVar10].x & 1) == 0) {
              iVar13 = local_34 * 2 + local_40->base_vlit;
              goto LAB_001391bf;
            }
            if ((iVar7 <= local_34) && (local_34 <= iVar8)) {
              if (local_34 == iVar7) {
                iVar7 = iVar7 + 1;
              }
              else if (local_34 == iVar8) {
                iVar8 = iVar8 + -1;
              }
              else {
                vec<int>::push(&local_58,&local_34);
                uVar5 = (ulong)head->sz;
                pCVar6 = sat.c_info.data;
              }
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar5);
      }
    }
  }
  if (iVar8 < iVar7) {
    puts("Domain wipeout??");
  }
  fflush(_stdout);
  if (local_40->lit_min == iVar7 && local_58.sz == 0) {
    iVar13 = local_40->base_blit + iVar8 * 2 + 2;
  }
  else if (local_40->lit_max == iVar8 && local_58.sz == 0) {
    iVar13 = local_40->base_blit + iVar7 * 2 + -1;
  }
  else {
    uVar9 = SAT::getLazyVar(&sat,::ci_null);
    pIVar4 = local_40;
    *(byte *)(sat.flags.data + uVar9) = *(byte *)(sat.flags.data + uVar9) & 0xfc;
    *(byte *)(sat.flags.data + uVar9) = *(byte *)(sat.flags.data + uVar9) & 0xfb;
    q.x = uVar9 * 2;
    if (iVar7 == local_40->lit_min) {
      SAT::addClause(&sat,(Lit)(*local_58.data * 2 + local_40->base_blit),q);
      iVar7 = *local_58.data;
    }
    if (iVar8 == pIVar4->lit_max) {
      SAT::addClause(&sat,(Lit)(pIVar4->base_blit + local_58.data[local_58.sz - 1] * 2 + 1),q);
      iVar8 = local_58.data[local_58.sz - 1];
    }
    iVar13 = uVar9 * 2 + 1;
    if (iVar7 <= iVar8) {
      iVar12 = iVar7 * 2;
      uVar9 = 0;
      do {
        if (((int)uVar9 < (int)local_58.sz) && (iVar7 == local_58.data[uVar9])) {
          uVar9 = uVar9 + 1;
        }
        else {
          iVar1 = local_40->base_vlit;
          c = (Clause *)malloc(0xc);
          *(undefined4 *)c = 0x200;
          c->data[0].x = iVar1 + iVar12;
          *(int *)(c + 1) = q.x;
          SAT::addClause(&sat,c,true);
        }
        iVar7 = iVar7 + 1;
        iVar12 = iVar12 + 2;
      } while (iVar8 + 1 != iVar7);
    }
  }
LAB_001391bf:
  if (local_58.data != (int *)0x0) {
    free(local_58.data);
  }
  return (Lit)iVar13;
}

Assistant:

Lit IntVarEL::createSetLit(vec<Lit>& head) {
	// lb, ub and holes, which together cause the conflict
	int lower_bound = lit_min;
	int upper_bound = lit_max;
	vec<int> holes;

	std::sort((Lit*)head, (Lit*)head + head.size());

	// process bounds lits first
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 0) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < upper_bound) {
				upper_bound = v;
			}
		} else {
			if (v + 1 > lower_bound) {
				lower_bound = v + 1;
			}
		}
	}

	// process val lits
	for (unsigned int i = 0; i < head.size(); i++) {
		const ChannelInfo& ci = sat.c_info[var(head[i])];
		if (ci.val_type == 1) {
			continue;
		}
		const int v = ci.val;
		if (sign(head[i])) {
			if (v < lower_bound || v > upper_bound) {
				continue;
			}
			if (v == lower_bound) {
				lower_bound++;
				continue;
			}
			if (v == upper_bound) {
				upper_bound--;
				continue;
			}
			holes.push(v);
		} else {
			return getNELit(v);
		}
	}

	if (lower_bound > upper_bound) {
		printf("Domain wipeout??\n");
		assert(false);
	}

	//	printf("lower_bound = %d, upper_bound = %d\n", lower_bound, upper_bound);
	//	for (int i = 0; i < holes.size(); i++) printf("%d ", holes[i]); printf("\n");

	fflush(stdout);

	// Check cases where an original lit is sufficient

	if (lower_bound == lit_min && holes.size() == 0) {
		return getGELit(upper_bound + 1);
	}
	if (upper_bound == lit_max && holes.size() == 0) {
		return getLELit(lower_bound - 1);
	}

	// Create new lit that complements failure set

	Lit q = Lit(sat.getLazyVar(ci_null), true);
	sat.flags[var(q)].setUIPable(false);
	sat.flags[var(q)].setLearnable(false);

	vec<Lit> ps(2);
	ps[1] = ~q;

	if (lower_bound == lit_min) {
		// can use bounds lit for lower bound
		sat.addClause(getGELit(holes[0]), ~q);
		lower_bound = holes[0];
		//		printf("GE: %d\n", holes[0]);
	}
	if (upper_bound == lit_max) {
		// can use bounds lit for upper bound
		sat.addClause(getLELit(holes.last()), ~q);
		upper_bound = holes.last();
		//		printf("LE: %d\n", holes.last());
	}
	int j = 0;
	for (int i = lower_bound; i <= upper_bound; i++) {
		if (j < static_cast<int>(holes.size()) && i == holes[j]) {
			j++;
			continue;
		}
		ps[0] = getNELit(i);
		sat.addClause(*Clause_new(ps), true);
		//		printf("NE: %d\n", i);
	}

	//	printf("New lit = %d\n", toInt(q));

	return q;
}